

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O3

SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> * __thiscall
Js::NullTypeHandlerBase::
ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
          (NullTypeHandlerBase *this,DynamicObject *instance)

{
  ScriptContext *scriptContext;
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  PropertyTypes values;
  int iVar4;
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_01;
  undefined4 *puVar5;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = scriptContext->recycler;
  local_58 = (undefined1  [8])
             &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
              typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9cd1cad;
  data.filename._0_4_ = 0xea;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_58);
  this_01 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *)
            new<Memory::Recycler>(0x30,alloc,0x387914);
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
  SimpleDictionaryTypeHandlerBase(this_01,this_00);
  if (((this_01->super_DynamicTypeHandler).flags & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/NullTypeHandler.cpp"
                                ,0xeb,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "(newTypeHandler->GetFlags() & IsPrototypeFlag) == 0");
    if (!bVar2) goto LAB_00dbb770;
    *puVar5 = 0;
  }
  DynamicObject::EnsureSlots
            (instance,0,(this_01->super_DynamicTypeHandler).slotCapacity,scriptContext,
             (DynamicTypeHandler *)this_01);
  bVar3 = (this->super_DynamicTypeHandler).flags;
  if ((bVar3 >> 5 & 1) != (this->super_DynamicTypeHandler).field_0x15) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/NullTypeHandler.cpp"
                                ,0xee,
                                "(((this->GetFlags() & IsPrototypeFlag) != 0) == this->isPrototype)"
                                ,"((this->GetFlags() & IsPrototypeFlag) != 0) == this->isPrototype")
    ;
    if (!bVar2) {
LAB_00dbb770:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    bVar3 = (this->super_DynamicTypeHandler).flags;
  }
  DynamicTypeHandler::SetFlags((DynamicTypeHandler *)this_01,bVar3 & 0x20);
  values = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_01,0xf0,values);
  iVar4 = (*(instance->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(instance);
  if ((char)iVar4 != '\0') {
    DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)this_01,false);
  }
  DynamicTypeHandler::SetInstanceTypeHandler((DynamicTypeHandler *)this_01,instance,true);
  return this_01;
}

Assistant:

T* NullTypeHandlerBase::ConvertToTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        T * newTypeHandler = RecyclerNew(recycler, T, recycler);
        Assert((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0);
        // EnsureSlots before updating the type handler and instance, as EnsureSlots allocates and may throw.
        instance->EnsureSlots(0, newTypeHandler->GetSlotCapacity(), scriptContext, newTypeHandler);
        Assert(((this->GetFlags() & IsPrototypeFlag) != 0) == this->isPrototype);
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesInlineSlotCapacityLocked | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        if (instance->HasReadOnlyPropertiesInvisibleToTypeHandler())
        {
            newTypeHandler->ClearHasOnlyWritableDataProperties();
        }
        newTypeHandler->SetInstanceTypeHandler(instance);

        return newTypeHandler;
    }